

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

void __thiscall
SpeciesTracker::TerminateTranslation
          (SpeciesTracker *this,shared_ptr<PolymerWrapper> *wrapper,string *pol_name,
          string *gene_name)

{
  shared_ptr<Reaction> local_38;
  string *local_28;
  string *gene_name_local;
  string *pol_name_local;
  shared_ptr<PolymerWrapper> *wrapper_local;
  SpeciesTracker *this_local;
  
  local_28 = gene_name;
  gene_name_local = pol_name;
  pol_name_local = (string *)wrapper;
  wrapper_local = (shared_ptr<PolymerWrapper> *)this;
  Increment(this,pol_name,1);
  Increment(this,local_28,1);
  IncrementRibo(this,local_28,-1);
  std::shared_ptr<Reaction>::shared_ptr<PolymerWrapper,void>(&local_38,wrapper);
  Signal<std::shared_ptr<Reaction>_>::Emit(&this->propensity_signal_,&local_38);
  std::shared_ptr<Reaction>::~shared_ptr(&local_38);
  return;
}

Assistant:

void SpeciesTracker::TerminateTranslation(
    std::shared_ptr<PolymerWrapper> wrapper, const std::string &pol_name,
    const std::string &gene_name) {
  Increment(pol_name, 1);
  Increment(gene_name, 1);
  IncrementRibo(gene_name, -1);
  propensity_signal_.Emit(wrapper);
  // CountTermination(gene_name);
}